

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O2

int __thiscall
SslUdpSocketImpl::DatenDecode
          (SslUdpSocketImpl *this,uint8_t *buffer,size_t nAnzahl,string *strAddress)

{
  mutex *pmVar1;
  atomic<unsigned_long> *paVar2;
  SslConnection *this_00;
  BaseSocket *pBVar3;
  int iVar4;
  uint __val;
  int iVar5;
  size_t sVar6;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> _Var7;
  UdpSocket *pUVar8;
  uint8_t *szBuffer;
  SSL *pSVar9;
  bool bVar10;
  unsigned_long __n2;
  __array temp;
  size_t len;
  size_t len_1;
  mutex *local_118;
  size_t local_110;
  size_t local_108;
  unique_lock<std::mutex> lock1;
  unique_lock<std::mutex> lock;
  size_t anz;
  __array temp_1;
  int iErrorHint;
  wstring local_70;
  wstring local_50;
  
  if (nAnzahl == 0 || buffer == (uint8_t *)0x0) {
    return 0;
  }
  local_118 = &this->m_mxEnDecode;
  std::unique_lock<std::mutex>::unique_lock(&lock,local_118);
  local_108 = nAnzahl;
  local_110 = OpenSSLWrapper::SslConnection::SslPutInData
                        ((this->m_pSslCon)._M_t.
                         super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl
                         ,buffer,nAnzahl);
  std::unique_lock<std::mutex>::unlock(&lock);
  iVar5 = -1;
  if (this->m_bCloseReq == false) {
    iVar4 = OpenSSLWrapper::SslConnection::SSLGetShutdown
                      ((this->m_pSslCon)._M_t.
                       super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
    this_00 = (this->m_pSslCon)._M_t.
              super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
              ._M_t.
              super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
              .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl;
    if (iVar4 < 2) {
      iVar4 = OpenSSLWrapper::SslConnection::SslInitFinished(this_00);
      if (iVar4 == 0) {
        iVar4 = OpenSSLWrapper::SslConnection::SSLDoHandshake
                          ((this->m_pSslCon)._M_t.
                           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                           _M_head_impl);
        std::unique_lock<std::mutex>::unique_lock(&lock1,local_118);
        sVar6 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                          ((this->m_pSslCon)._M_t.
                           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                           _M_head_impl);
        pmVar1 = &(this->super_UdpSocketImpl).m_mxOutDeque;
        bVar10 = false;
        while (sVar6 != 0) {
          _Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
               operator_new__(sVar6);
          memset((void *)_Var7.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,sVar6);
          temp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
          .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
               (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
               _Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
               _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          len = OpenSSLWrapper::SslConnection::SslGetOutData
                          ((this->m_pSslCon)._M_t.
                           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                           _M_head_impl,
                           (uint8_t *)
                           _Var7.
                           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                           .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,sVar6);
          if (len != 0) {
            std::mutex::lock(pmVar1);
            LOCK();
            paVar2 = &(this->super_UdpSocketImpl).m_atOutBytes;
            (paVar2->super___atomic_base<unsigned_long>)._M_i =
                 (paVar2->super___atomic_base<unsigned_long>)._M_i + len;
            UNLOCK();
            std::
            deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
            ::
            emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long_const&,std::__cxx11::string_const&>
                      ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                        *)&(this->super_UdpSocketImpl).m_quOutData,&temp,&len,strAddress);
            pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
            bVar10 = true;
          }
          sVar6 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                            ((this->m_pSslCon)._M_t.
                             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                             _M_head_impl);
          std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                    (&temp);
        }
        std::unique_lock<std::mutex>::unlock(&lock1);
        if (bVar10) {
          UdpSocketImpl::TriggerWriteThread(&this->super_UdpSocketImpl);
        }
        if (iVar4 < 1) {
          __val = OpenSSLWrapper::SslConnection::SSLGetError
                            ((this->m_pSslCon)._M_t.
                             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                             _M_head_impl,iVar4);
          if (__val != 2) {
            (this->super_UdpSocketImpl).super_BaseSocketImpl.m_iError = __val | 0x80000000;
            (this->super_UdpSocketImpl).super_BaseSocketImpl.m_iErrLoc = 0xe;
            std::__cxx11::to_wstring((wstring *)&iErrorHint,__val);
            std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                            *)&anz,L"SSL_error: ",
                           (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                            *)&iErrorHint);
            std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                            *)&temp_1,
                           (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                            *)&anz,L", after SSL_do_handshake returned: ");
            std::__cxx11::to_wstring(&local_50,iVar4);
            std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                            *)&len_1,
                           (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                            *)&temp_1,&local_50);
            std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                            *)&len,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                    *)&len_1,L" on ssl context: ");
            pSVar9 = OpenSSLWrapper::SslConnection::operator()
                               ((this->m_pSslCon)._M_t.
                                super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                                _M_head_impl);
            std::__cxx11::to_wstring(&local_70,(unsigned_long)pSVar9);
            std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                            *)&temp,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                     *)&len,&local_70);
            OutputDebugString((wchar_t *)
                              temp._M_t.
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
            std::__cxx11::wstring::~wstring((wstring *)&temp);
            std::__cxx11::wstring::~wstring((wstring *)&local_70);
            std::__cxx11::wstring::~wstring((wstring *)&len);
            std::__cxx11::wstring::~wstring((wstring *)&len_1);
            std::__cxx11::wstring::~wstring((wstring *)&local_50);
            std::__cxx11::wstring::~wstring((wstring *)&temp_1);
            std::__cxx11::wstring::~wstring((wstring *)&anz);
            std::__cxx11::wstring::~wstring((wstring *)&iErrorHint);
            OpenSSLWrapper::SslConnection::GetSslErrAsString_abi_cxx11_
                      ((string *)&len,
                       (this->m_pSslCon)._M_t.
                       super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &temp,", msg: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len
                          );
            OutputDebugStringA((char *)temp._M_t.
                                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
            std::__cxx11::string::~string((string *)&temp);
            std::__cxx11::string::~string((string *)&len);
            bVar10 = (this->super_UdpSocketImpl).super_BaseSocketImpl.m_bStop;
            if (bVar10 == false &&
                (this->super_UdpSocketImpl).super_BaseSocketImpl.m_fErrorParam.super__Function_base.
                _M_manager != (_Manager_type)0x0) {
              std::function<void_(BaseSocket_*,_void_*)>::operator()
                        (&(this->super_UdpSocketImpl).super_BaseSocketImpl.m_fErrorParam,
                         (this->super_UdpSocketImpl).super_BaseSocketImpl.m_pBkRef,
                         (this->super_UdpSocketImpl).super_BaseSocketImpl.m_pvUserData);
            }
            else if ((this->super_UdpSocketImpl).super_BaseSocketImpl.m_fError.super__Function_base.
                     _M_manager != (_Manager_type)0x0 && bVar10 == false) {
              std::function<void_(BaseSocket_*)>::operator()
                        (&(this->super_UdpSocketImpl).super_BaseSocketImpl.m_fError,
                         (this->super_UdpSocketImpl).super_BaseSocketImpl.m_pBkRef);
            }
            std::unique_lock<std::mutex>::~unique_lock(&lock1);
            goto LAB_001106a6;
          }
        }
        else if ((this->m_fSllInitDoneParam).super__Function_base._M_manager == (_Manager_type)0x0)
        {
          if ((this->m_fSllInitDone).super__Function_base._M_manager != (_Manager_type)0x0) {
            pBVar3 = (this->super_UdpSocketImpl).super_BaseSocketImpl.m_pBkRef;
            if (pBVar3 == (BaseSocket *)0x0) {
              pUVar8 = (UdpSocket *)0x0;
            }
            else {
              pUVar8 = (UdpSocket *)
                       __dynamic_cast(pBVar3,&BaseSocket::typeinfo,&UdpSocket::typeinfo,0);
            }
            std::function<void_(UdpSocket_*)>::operator()(&this->m_fSllInitDone,pUVar8);
          }
        }
        else {
          pBVar3 = (this->super_UdpSocketImpl).super_BaseSocketImpl.m_pBkRef;
          if (pBVar3 == (BaseSocket *)0x0) {
            pUVar8 = (UdpSocket *)0x0;
          }
          else {
            pUVar8 = (UdpSocket *)
                     __dynamic_cast(pBVar3,&BaseSocket::typeinfo,&UdpSocket::typeinfo,0);
          }
          std::function<void_(UdpSocket_*,_void_*)>::operator()
                    (&this->m_fSllInitDoneParam,pUVar8,
                     (this->super_UdpSocketImpl).super_BaseSocketImpl.m_pvUserData);
        }
        std::unique_lock<std::mutex>::~unique_lock(&lock1);
      }
      if (iVar4 == 1) {
        szBuffer = (uint8_t *)operator_new__(0xffff);
        memset(szBuffer,0,0xffff);
        iErrorHint = 0;
        len = (size_t)szBuffer;
        len_1 = OpenSSLWrapper::SslConnection::SslRead
                          ((this->m_pSslCon)._M_t.
                           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                           _M_head_impl,szBuffer,0xffff,&iErrorHint);
        pmVar1 = &(this->super_UdpSocketImpl).m_mxInDeque;
        while (sVar6 = len_1, len_1 != 0) {
          _Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
               operator_new__(len_1);
          memset((void *)_Var7.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,sVar6);
          temp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
          .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
               (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
               _Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
               _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          memmove((void *)_Var7.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,(void *)len,
                  sVar6);
          std::mutex::lock(pmVar1);
          std::
          deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
          ::
          emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&,std::__cxx11::string_const&>
                    ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                      *)&(this->super_UdpSocketImpl).m_quInData,&temp,&len_1,strAddress);
          LOCK();
          paVar2 = &(this->super_UdpSocketImpl).m_atInBytes;
          (paVar2->super___atomic_base<unsigned_long>)._M_i =
               (paVar2->super___atomic_base<unsigned_long>)._M_i + len_1;
          UNLOCK();
          pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
          len_1 = OpenSSLWrapper::SslConnection::SslRead
                            ((this->m_pSslCon)._M_t.
                             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                             _M_head_impl,(uint8_t *)len,0xffff,&iErrorHint);
          std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                    (&temp);
        }
        std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&temp,local_118);
        sVar6 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                          ((this->m_pSslCon)._M_t.
                           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                           _M_head_impl);
        pmVar1 = &(this->super_UdpSocketImpl).m_mxOutDeque;
        bVar10 = false;
        while (sVar6 != 0) {
          _Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
               operator_new__(sVar6);
          memset((void *)_Var7.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,sVar6);
          temp_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
          _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
               (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
               _Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
               _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          anz = OpenSSLWrapper::SslConnection::SslGetOutData
                          ((this->m_pSslCon)._M_t.
                           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                           _M_head_impl,
                           (uint8_t *)
                           _Var7.
                           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                           .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,sVar6);
          if (anz != 0) {
            std::mutex::lock(pmVar1);
            LOCK();
            paVar2 = &(this->super_UdpSocketImpl).m_atOutBytes;
            (paVar2->super___atomic_base<unsigned_long>)._M_i =
                 (paVar2->super___atomic_base<unsigned_long>)._M_i + anz;
            UNLOCK();
            std::
            deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
            ::
            emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long_const&,std::__cxx11::string_const&>
                      ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                        *)&(this->super_UdpSocketImpl).m_quOutData,&temp_1,&anz,strAddress);
            pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
            bVar10 = true;
          }
          sVar6 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                            ((this->m_pSslCon)._M_t.
                             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                             _M_head_impl);
          std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                    (&temp_1);
        }
        std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&temp);
        if (bVar10) {
          UdpSocketImpl::TriggerWriteThread(&this->super_UdpSocketImpl);
        }
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&temp);
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                  ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len);
        iVar5 = 1;
      }
      else {
        iVar5 = -1;
      }
      local_108 = local_108 - local_110;
      if (local_108 != 0 && local_110 != 0) {
        pSVar9 = OpenSSLWrapper::SslConnection::operator()
                           ((this->m_pSslCon)._M_t.
                            super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                            .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                            _M_head_impl);
        std::__cxx11::to_wstring((wstring *)&len_1,(unsigned_long)pSVar9);
        std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )&len,L"SslPutInData konnte nicht alles fassen on ssl context: ",
                       (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )&len_1);
        std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )&temp,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)&len,L"\r\n");
        OutputDebugString((wchar_t *)
                          temp._M_t.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
        std::__cxx11::wstring::~wstring((wstring *)&temp);
        std::__cxx11::wstring::~wstring((wstring *)&len);
        std::__cxx11::wstring::~wstring((wstring *)&len_1);
        iVar5 = DatenDecode(this,buffer + local_110,local_108,strAddress);
      }
    }
    else {
      OpenSSLWrapper::SslConnection::ShutDownConnection(this_00,(int *)0x0);
      (*(this->super_UdpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl[2])(this);
    }
  }
LAB_001106a6:
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return iVar5;
}

Assistant:

int SslUdpSocketImpl::DatenDecode(const uint8_t* buffer, size_t nAnzahl, const string& strAddress)
{
    if (buffer == nullptr || nAnzahl == 0)
        return 0;

    unique_lock<mutex> lock(m_mxEnDecode);
    const size_t nPut = m_pSslCon->SslPutInData(buffer, nAnzahl);
    lock.unlock();

    if (m_bCloseReq == true)
        return -1;

    if (m_pSslCon->SSLGetShutdown() >= SSL_RECEIVED_SHUTDOWN)
    {
        m_pSslCon->ShutDownConnection();
        Close();
        return -1;
    }

    int iSslInit = m_pSslCon->SslInitFinished();
    if (iSslInit == 0)
    {
        iSslInit = m_pSslCon->SSLDoHandshake();

        bool bNewData = false;
        unique_lock<mutex> lock1(m_mxEnDecode);
        // Get the out Que of the openssl bio, the buffer is already encrypted
        size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
        while (nOutDataSize > 0)
        {
            auto temp = make_unique<uint8_t[]>(nOutDataSize);
            const size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
            // Schreibt Daten in die SOCKET
            if (len > 0)
            {
                m_mxOutDeque.lock();
                m_atOutBytes += len;
                m_quOutData.emplace_back(move(temp), len, strAddress);
                m_mxOutDeque.unlock();
                bNewData = true;
            }
            nOutDataSize = m_pSslCon->SslGetOutDataSize();
        }
        lock1.unlock();

        if (bNewData == true)
            TriggerWriteThread();

        if (iSslInit <= 0)
        {
            const int iError = m_pSslCon->SSLGetError(iSslInit);
            if (iError != SSL_ERROR_WANT_READ)
            {
                m_iError = 0x80000000 | iError;
                m_iErrLoc = 14;
                OutputDebugString(wstring(L"SSL_error: " + to_wstring(iError) + L", after SSL_do_handshake returned: " + to_wstring(iSslInit) + L" on ssl context: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)()))).c_str());
                OutputDebugStringA(string(", msg: " + m_pSslCon->GetSslErrAsString()).c_str());
                if (m_fErrorParam && m_bStop == false)
                    m_fErrorParam(m_pBkRef, m_pvUserData);
                else if (m_fError && m_bStop == false)
                    m_fError(m_pBkRef);
                return -1;
            }
        }
        else
        {
            if (m_fSllInitDoneParam != nullptr)
                m_fSllInitDoneParam(dynamic_cast<UdpSocket*>(m_pBkRef), m_pvUserData);
            else if (m_fSllInitDone != nullptr)
                m_fSllInitDone(dynamic_cast<UdpSocket*>(m_pBkRef));
        }
    }

    int iReturn = -1;
    if (iSslInit == 1)
    {
        auto Buffer = make_unique<uint8_t[]>(0x0000ffff);
        int iErrorHint = 0;
        size_t len = m_pSslCon->SslRead(&Buffer[0], 0x0000ffff, &iErrorHint); // get receive data from the SSL layer, and put it into the unencrypted receive Que
        while (len > 0)
        {
            auto tmp = make_unique<uint8_t[]>(len);
            copy_n(&Buffer[0], len, &tmp[0]);
            m_mxInDeque.lock();
            m_quInData.emplace_back(move(tmp), len, strAddress);
            m_atInBytes += len;
            m_mxInDeque.unlock();

            len = m_pSslCon->SslRead(&Buffer[0], 0x0000ffff, &iErrorHint); // get receive data from the SSL layer, and put it into the unencrypted receive Que
        }
        iReturn = 1;

        bool bNewData = false;
        unique_lock<mutex> lock1(m_mxEnDecode);
        // Get the out Que of the openssl bio, the buffer is already encrypted
        size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
        while (nOutDataSize > 0)
        {
            auto temp = make_unique<uint8_t[]>(nOutDataSize);
            const size_t anz = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
            // Schreibt Daten in die SOCKET
            if (anz > 0)
            {
                m_mxOutDeque.lock();
                m_atOutBytes += anz;
                m_quOutData.emplace_back(move(temp), anz, strAddress);
                m_mxOutDeque.unlock();
                bNewData = true;
            }
            nOutDataSize = m_pSslCon->SslGetOutDataSize();
        }
        lock1.unlock();

        if (bNewData == true)
            TriggerWriteThread();
    }

    if (nPut != 0 && nPut != nAnzahl)
    {
        OutputDebugString(wstring(L"SslPutInData konnte nicht alles fassen on ssl context: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)())) + L"\r\n").c_str());
        return DatenDecode(&buffer[nPut], nAnzahl - nPut, strAddress);
    }

    return iReturn;
}